

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O2

int EVP_DecodeUpdate(EVP_ENCODE_CTX *ctx,uchar *out,int *outl,uchar *in,int inl)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  undefined4 in_register_00000084;
  size_t num_bytes_resulting;
  
  *outl = 0;
  if (ctx->enc_data[0x2d] != '\0') {
    return -1;
  }
  uVar5 = 0;
  lVar4 = 0;
  do {
    if (CONCAT44(in_register_00000084,inl) == lVar4) {
      if (uVar5 >> 0x1f == 0) {
        *outl = (int)uVar5;
        uVar2 = (uint)(ctx->enc_data[0x2c] == '\0');
      }
      else {
        ctx->enc_data[0x2d] = '\x01';
        *outl = 0;
LAB_0023e41e:
        uVar2 = 0xffffffff;
      }
      return uVar2;
    }
    bVar1 = in[lVar4];
    if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
      if (ctx->enc_data[0x2c] != '\0') {
LAB_0023e419:
        ctx->enc_data[0x2d] = '\x01';
        goto LAB_0023e41e;
      }
      uVar2 = ctx->num;
      iVar3 = uVar2 + 1;
      ctx->num = iVar3;
      ctx->enc_data[(ulong)uVar2 - 4] = bVar1;
      if (iVar3 == 4) {
        iVar3 = base64_decode_quad(out,&num_bytes_resulting,(uint8_t *)&ctx->length);
        if (iVar3 == 0) goto LAB_0023e419;
        ctx->num = 0;
        if (num_bytes_resulting < 3) {
          ctx->enc_data[0x2c] = '\x01';
        }
        uVar5 = uVar5 + num_bytes_resulting;
        out = out + num_bytes_resulting;
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

int EVP_DecodeUpdate(EVP_ENCODE_CTX *ctx, uint8_t *out, int *out_len,
                     const uint8_t *in, size_t in_len) {
  *out_len = 0;

  if (ctx->error_encountered) {
    return -1;
  }

  size_t bytes_out = 0, i;
  for (i = 0; i < in_len; i++) {
    const char c = in[i];
    switch (c) {
      case ' ':
      case '\t':
      case '\r':
      case '\n':
        continue;
    }

    if (ctx->eof_seen) {
      ctx->error_encountered = 1;
      return -1;
    }

    ctx->data[ctx->data_used++] = c;
    if (ctx->data_used == 4) {
      size_t num_bytes_resulting;
      if (!base64_decode_quad(out, &num_bytes_resulting, ctx->data)) {
        ctx->error_encountered = 1;
        return -1;
      }

      ctx->data_used = 0;
      bytes_out += num_bytes_resulting;
      out += num_bytes_resulting;

      if (num_bytes_resulting < 3) {
        ctx->eof_seen = 1;
      }
    }
  }

  if (bytes_out > INT_MAX) {
    ctx->error_encountered = 1;
    *out_len = 0;
    return -1;
  }
  *out_len = (int)bytes_out;

  if (ctx->eof_seen) {
    return 0;
  }

  return 1;
}